

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

void __thiscall hta::Metric::insert(Metric *this,TimeValue tv)

{
  Duration interval;
  _Head_base<0UL,_hta::storage::Metric_*,_false> _Var1;
  double minimum;
  TimeAggregate ta;
  Row row;
  Level *this_00;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tVar2;
  out_of_range *poVar3;
  duration __val;
  type partial_duration;
  Aggregate partial_interval;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __val.__r = (rep)tv.time.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r;
  minimum = tv.value;
  check_write(this);
  if ((duration)__val.__r == (duration)0x0) {
    poVar3 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar3,"cannot insert invalid (0) hta::TimePoint");
    __cxa_throw(poVar3,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if ((this->previous_time_).
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r < __val.__r) {
    (this->previous_time_).
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
         = __val.__r;
    interval.__r = (this->interval_min_).__r;
    this_00 = get_level(this,interval);
    _Var1._M_head_impl =
         (this->storage_metric_)._M_t.
         super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>.
         _M_t.
         super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
         super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl;
    (*(_Var1._M_head_impl)->_vptr_Metric[2])(tv.value._0_4_,_Var1._M_head_impl,__val.__r);
    tVar2.__d.__r =
         (duration)
         (this_00->time_current).
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
    if (tVar2.__d.__r == 0) {
      (this_00->time_current).
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = __val.__r;
      tVar2.__d.__r = (duration)(duration)__val.__r;
    }
    tVar2.__d.__r = (duration)interval_end((TimePoint)tVar2.__d.__r,interval);
    while( true ) {
      if (__val.__r < (long)tVar2.__d.__r) {
        Level::advance(this_00,tv);
        return;
      }
      partial_duration.__r =
           (long)tVar2.__d.__r -
           (this_00->time_current).
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
           __d.__r;
      if (interval.__r < partial_duration.__r) break;
      Aggregate::Aggregate
                (&partial_interval,minimum,minimum,0.0,0,(double)partial_duration.__r * minimum,
                 &partial_duration);
      ta.aggregate.minimum = partial_interval.minimum;
      ta.time.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            tVar2.__d.__r;
      ta.aggregate.maximum = partial_interval.maximum;
      ta.aggregate.sum = partial_interval.sum;
      ta.aggregate.count = partial_interval.count;
      ta.aggregate.integral = partial_interval.integral;
      ta.aggregate.active_time.__r = partial_interval.active_time.__r;
      Level::advance(this_00,ta);
      row.time.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            ((long)tVar2.__d.__r - interval.__r);
      row.interval.__r = interval.__r;
      row.aggregate.minimum = (this_00->aggregate).minimum;
      row.aggregate.maximum = (this_00->aggregate).maximum;
      row.aggregate.sum = (this_00->aggregate).sum;
      row.aggregate.count = (this_00->aggregate).count;
      row.aggregate.integral = (this_00->aggregate).integral;
      row.aggregate.active_time.__r = (this_00->aggregate).active_time.__r;
      insert(this,row);
      (this_00->time_current).
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (rep)tVar2.__d.__r;
      (this_00->aggregate).minimum = INFINITY;
      (this_00->aggregate).maximum = -INFINITY;
      (this_00->aggregate).integral = 0.0;
      (this_00->aggregate).active_time.__r = 0;
      (this_00->aggregate).sum = 0.0;
      (this_00->aggregate).count = 0;
      tVar2.__d.__r = (duration)interval_end((TimePoint)tVar2.__d.__r,interval);
    }
    __assert_fail("partial_duration <= interval",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                  ,0x21f,"void hta::Metric::insert(TimeValue)");
  }
  poVar3 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string
            (&local_70,
             (this->previous_time_).
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r);
  std::operator+(&local_50,"trying to add non-monotonic timestamp; previous ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &partial_duration,&local_50," new ");
  std::__cxx11::to_string(&local_90,__val.__r);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &partial_interval,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &partial_duration,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
  std::out_of_range::out_of_range(poVar3,(string *)&partial_interval);
  __cxa_throw(poVar3,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

void Metric::insert(TimeValue tv)
{
    check_write();
    // Evaluate if these two consistency checks hurt performance
    // Must not have an "invalid" time value... who knows what would happen...
    if (!tv.time)
    {
        throw std::out_of_range("cannot insert invalid (0) hta::TimePoint");
    }
    if (tv.time <= previous_time_)
    {
        throw std::out_of_range("trying to add non-monotonic timestamp; previous " +
                                std::to_string(previous_time_.time_since_epoch().count()) +
                                " new " + std::to_string(tv.time.time_since_epoch().count()));
    }
    previous_time_ = tv.time;

    const auto interval = interval_min_;
    auto& level = get_level(interval);
    // We must do this after get_level, otherwise it confuses the level restore
    storage_metric_->insert(tv);

    if (!level.time_current)
    {
        // level.time_current = interval_begin(tv.time, interval);
        level.time_current = tv.time;
    }
    auto level_time_end = interval_end(level.time_current, interval);
    while (tv.time >= level_time_end)
    {
        // the point doesn't belong in the current interval,
        // but some of it's integral may..
        auto partial_duration = level_time_end - level.time_current;
        assert(partial_duration <= interval);
        // TODO move this into a clever method of Aggregate itself
        Aggregate partial_interval{
            tv.value, tv.value, 0, 0, tv.value * partial_duration.count(), partial_duration
        };
        level.advance({ level_time_end, partial_interval });

        auto level_time_begin = level_time_end - interval;

        // Inform higher levels of this new closed level
        insert({ interval, level_time_begin, level.aggregate });

        // reset the interval at lowest level
        level = Level(level_time_end);
        level_time_end = interval_end(level.time_current, interval);
    }
    level.advance(tv);
}